

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

QStyle * QApplication::style(void)

{
  bool bVar1;
  QApplication *pQVar2;
  const_iterator o;
  QString *key;
  QCoreApplication *pQVar3;
  long in_FS_OFFSET;
  QString *style;
  QStringList *__range3;
  QStyle **defaultStyle;
  const_iterator __end3;
  const_iterator __begin3;
  QStringList styles;
  QList<QString> *in_stack_ffffffffffffff80;
  QStyle *pQVar4;
  QString *in_stack_ffffffffffffff90;
  QString *in_stack_ffffffffffffff98;
  QStyle **this;
  QStyle *local_58;
  const_iterator local_40;
  QString local_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (QApplicationPrivate::app_style == (QStyle *)0x0) {
    QCoreApplication::instance();
    pQVar2 = qobject_cast<QApplication*>((QObject *)0x2ca22a);
    if (pQVar2 == (QApplication *)0x0) {
      local_58 = (QStyle *)0x0;
      goto LAB_002ca40b;
    }
    this = &QApplicationPrivate::app_style;
    QApplicationPrivate::desktopStyleKey();
    QApplicationPrivate::app_style = QStyleFactory::create(in_stack_ffffffffffffff90);
    QString::~QString((QString *)0x2ca275);
    if (QApplicationPrivate::app_style == (QStyle *)0x0) {
      local_38[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_38[0].d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_38[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QStyleFactory::keys();
      in_stack_ffffffffffffff98 = local_38;
      local_40.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_40 = QList<QString>::begin(in_stack_ffffffffffffff80);
      o = QList<QString>::end(in_stack_ffffffffffffff80);
      while (bVar1 = QList<QString>::const_iterator::operator!=(&local_40,o), bVar1) {
        key = QList<QString>::const_iterator::operator*(&local_40);
        QApplicationPrivate::app_style = QStyleFactory::create(key);
        if (QApplicationPrivate::app_style != (QStyle *)0x0) break;
        QList<QString>::const_iterator::operator++(&local_40);
      }
      QList<QString>::~QList((QList<QString> *)0x2ca374);
    }
    pQVar4 = QApplicationPrivate::app_style;
    if (QApplicationPrivate::app_style == (QStyle *)0x0) {
      local_58 = (QStyle *)0x0;
      goto LAB_002ca40b;
    }
    QCoreApplication::instance();
    QObject::setParent(&pQVar4->super_QObject);
    QGuiApplicationPrivate::updatePalette();
    bVar1 = QString::isEmpty((QString *)0x2ca3be);
    if (bVar1) {
      pQVar4 = QApplicationPrivate::app_style;
      pQVar3 = QCoreApplication::instance();
      (**(code **)(*(long *)pQVar4 + 0x70))(pQVar4,pQVar3);
    }
    else {
      QCoreApplication::instance();
      setStyleSheet((QApplication *)this,in_stack_ffffffffffffff98);
    }
  }
  local_58 = QApplicationPrivate::app_style;
LAB_002ca40b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_58;
}

Assistant:

QStyle *QApplication::style()
{
    if (!QApplicationPrivate::app_style) {
        // Create default style
        if (!qobject_cast<QApplication *>(QCoreApplication::instance())) {
            Q_ASSERT(!"No style available without QApplication!");
            return nullptr;
        }

        auto &defaultStyle = QApplicationPrivate::app_style;

        defaultStyle = QStyleFactory::create(QApplicationPrivate::desktopStyleKey());
        if (!defaultStyle) {
            const QStringList styles = QStyleFactory::keys();
            for (const auto &style : styles) {
                if ((defaultStyle = QStyleFactory::create(style)))
                    break;
            }
        }
        if (!defaultStyle) {
            Q_ASSERT(!"No styles available!");
            return nullptr;
        }

        // Take ownership of the style
        defaultStyle->setParent(qApp);

        QGuiApplicationPrivate::updatePalette();

#ifndef QT_NO_STYLE_STYLESHEET
        if (!QApplicationPrivate::styleSheet.isEmpty()) {
            qApp->setStyleSheet(QApplicationPrivate::styleSheet);
        } else
#endif
        {
            defaultStyle->polish(qApp);
        }
    }

    return QApplicationPrivate::app_style;
}